

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::sendInformation(Player *this,Time sendTime,int iteration)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference __n;
  size_type sVar5;
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *this_00;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  long in_RDI;
  int in_R8D;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff88;
  Publication *in_stack_ffffffffffffff90;
  vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
  *in_stack_ffffffffffffff98;
  reference this_01;
  unsigned_long in_stack_ffffffffffffffa0;
  ulong uVar6;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  bVar1 = isValidIndex<unsigned_long,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>
                    (in_stack_ffffffffffffffa0,
                     (vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    do {
      pvVar3 = CLI::std::
               vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
               operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)(in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&pvVar3->time,&local_8);
      if (!bVar1) break;
      CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
      operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                 (in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
      CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::operator[]
                ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)
                 in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
      CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
      operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                 (in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
      Publication::
      publish<std::variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      *(long *)(in_RDI + 0x250) = *(long *)(in_RDI + 0x250) + 1;
      uVar6 = *(ulong *)(in_RDI + 0x250);
      sVar5 = CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::size
                        ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0));
    } while (uVar6 < sVar5);
    bVar1 = isValidIndex<unsigned_long,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>
                      (in_stack_ffffffffffffffa0,
                       (vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        *)in_stack_ffffffffffffff98);
    if (bVar1) {
      do {
        pvVar3 = CLI::std::
                 vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                 operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                             *)(in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar3->time,&local_8);
        bVar1 = false;
        if (bVar2) {
          pvVar3 = CLI::std::
                   vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                   operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                               *)(in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
          bVar1 = pvVar3->iteration == in_EDX;
        }
        if (!bVar1) break;
        CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
        operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                   (in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
        CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::operator[]
                  ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)
                   in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
        CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
        operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
                   (in_RDI + 0xa0),*(size_type *)(in_RDI + 0x250));
        Publication::
        publish<std::variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>>
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *(long *)(in_RDI + 0x250) = *(long *)(in_RDI + 0x250) + 1;
        uVar6 = *(ulong *)(in_RDI + 0x250);
        sVar5 = CLI::std::
                vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::size
                          ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                            *)(in_RDI + 0xa0));
      } while (uVar6 < sVar5);
    }
  }
  bVar1 = isValidIndex<unsigned_long,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    do {
      pvVar4 = CLI::std::
               vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
               operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                           *)(in_RDI + 0xb8),*(size_type *)(in_RDI + 600));
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=(&pvVar4->sendTime,&local_8);
      if (!bVar1) {
        return;
      }
      this_00 = (deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)(in_RDI + 0x188);
      CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
      operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  *)(in_RDI + 0xb8),*(size_type *)(in_RDI + 600));
      __n = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::operator[]
                      (this_00,(size_type)in_stack_ffffffffffffff88);
      this_01 = __n;
      pvVar4 = CLI::std::
               vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
               operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                           *)(in_RDI + 0xb8),*(size_type *)(in_RDI + 600));
      Endpoint::send(this_01,(int)pvVar4 + 0x10,(void *)CONCAT44(extraout_var,extraout_EDX),
                     (size_t)__n,in_R8D);
      *(long *)(in_RDI + 600) = *(long *)(in_RDI + 600) + 1;
      uVar6 = *(ulong *)(in_RDI + 600);
      sVar5 = CLI::std::
              vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
              size((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                    *)(in_RDI + 0xb8));
    } while (uVar6 < sVar5);
  }
  return;
}

Assistant:

void Player::sendInformation(Time sendTime, int iteration)
{
    if (isValidIndex(pointIndex, points)) {
        while (points[pointIndex].time < sendTime) {
            publications[points[pointIndex].index].publish(points[pointIndex].value);
            ++pointIndex;
            if (pointIndex >= points.size()) {
                break;
            }
        }
        if (isValidIndex(pointIndex, points)) {
            while ((points[pointIndex].time == sendTime) &&
                   (points[pointIndex].iteration == iteration)) {
                publications[points[pointIndex].index].publish(points[pointIndex].value);
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
    }
    if (isValidIndex(messageIndex, messages)) {
        while (messages[messageIndex].sendTime <= sendTime) {
            endpoints[messages[messageIndex].index].send(messages[messageIndex].mess);
            ++messageIndex;
            if (messageIndex >= messages.size()) {
                break;
            }
        }
    }
}